

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O0

float Abc_ObjDelay0(Abc_IffMan_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  float fVar2;
  Abc_Obj_t *local_58;
  Abc_Obj_t *ppNodes [6];
  float local_20;
  int local_1c;
  float Delay0;
  int i;
  Abc_Obj_t *pObj_local;
  Abc_IffMan_t *p_local;
  
  local_20 = 0.0;
  Abc_ObjSortByDelay(p,pObj,1,&local_58);
  local_1c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 <= local_1c) break;
    fVar2 = Abc_IffDelay(p,ppNodes[(long)local_1c + -1],1);
    local_20 = Abc_MaxFloat(local_20,fVar2 + p->pPars->pLutDelays[local_1c]);
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

float Abc_ObjDelay0( Abc_IffMan_t * p, Abc_Obj_t * pObj )
{
    int i;
    float Delay0 = 0;
    Abc_Obj_t * ppNodes[6];
    Abc_ObjSortByDelay( p, pObj, 1, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        Delay0 = Abc_MaxFloat( Delay0, Abc_IffDelay(p, ppNodes[i], 1) + p->pPars->pLutDelays[i] );
    return Delay0;
}